

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O2

void __thiscall
VectorsTest_Int3ProductScalarAssignment_Test::TestBody
          (VectorsTest_Int3ProductScalarAssignment_Test *this)

{
  char *pcVar1;
  AssertHelper local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  int local_40 [2];
  AssertionResult gtest_ar;
  int local_24 [3];
  
  local_24[0] = 0xf;
  local_24[1] = 0x19;
  local_40[0] = -10;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x190000000f;
  local_24[2] = local_40[0];
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"v1.x","Int3(15, 25, -10).x",local_24,(int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x62,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x190000000f;
    local_40[0] = -10;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"v1.y","Int3(15, 25, -10).y",local_24 + 1,
               (int *)((long)&local_48.ptr_ + 4));
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_48.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x190000000f;
      local_40[0] = -10;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"v1.z","Int3(15, 25, -10).z",local_24 + 2,local_40);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                   ,0x62,pcVar1);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      goto LAB_00187568;
    }
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x62,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_48);
LAB_00187568:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(VectorsTest, Int3ProductScalarAssignment)
{
    Int3 v1(3, 5, -2);
    v1 *= 5;
    ASSERT_EQ_INT3(v1, Int3(15, 25, -10));
}